

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRasterizationTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles3::Functional::anon_unknown_1::PointCase::iterate(PointCase *this)

{
  undefined4 *puVar1;
  pointer pcVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  uint uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  bool bVar17;
  int iVar18;
  char *description;
  IterateResult IVar19;
  int pointNdx;
  long lVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  float extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  string local_268;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> drawBuffer;
  ScopedLogSection section;
  Surface resultImage;
  string iterationDescription;
  RasterizationArguments local_1d8;
  undefined1 local_1b8 [8];
  pointer pSStack_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [23];
  
  local_1d8.numSamples = *(int *)&(this->super_BaseRenderingCase).field_0xc4 + 1;
  de::toString<int>((string *)&drawBuffer,&local_1d8.numSamples);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&resultImage,
                 "Test iteration ",(string *)&drawBuffer);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&resultImage,
                 " / ");
  de::toString<int>(&local_268,&this->m_iterationCount);
  std::operator+(&iterationDescription,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                 &local_268);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::string::~string((string *)&resultImage);
  std::__cxx11::string::~string((string *)&drawBuffer);
  tcu::ScopedLogSection::ScopedLogSection
            (&section,((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
                      m_testCtx)->m_log,&iterationDescription,&iterationDescription);
  (*(this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[6])
            (this);
  iVar18 = (this->super_BaseRenderingCase).m_renderSize;
  tcu::Surface::Surface(&resultImage,iVar18,iVar18);
  drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_268.field_2._M_allocated_capacity = 0;
  local_268._M_dataplus._M_p = (pointer)0x0;
  local_268._M_string_length = 0;
  if (extraout_XMM0_Da <= this->m_maxPointSize) {
    uVar13 = *(uint *)&(this->super_BaseRenderingCase).field_0xc4;
    uVar21 = (ulong)uVar13;
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
              (&drawBuffer,6);
    if (uVar13 < 3) {
      fVar3 = *(float *)(&DAT_0183895c + uVar21 * 4);
      fVar4 = *(float *)(&DAT_01838968 + uVar21 * 4);
      fVar5 = *(float *)(&DAT_01838974 + uVar21 * 4);
      fVar6 = *(float *)(&DAT_01838980 + uVar21 * 4);
      fVar7 = *(float *)(&DAT_0183898c + uVar21 * 4);
      fVar8 = *(float *)(&DAT_01838998 + uVar21 * 4);
      fVar9 = *(float *)(&DAT_018389a4 + uVar21 * 4);
      fVar10 = *(float *)(&DAT_018389b0 + uVar21 * 4);
      fVar11 = *(float *)(&DAT_018389bc + uVar21 * 4);
      fVar12 = *(float *)(&DAT_018389c8 + uVar21 * 4);
      (drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->m_data[0] =
           *(float *)(&DAT_01838950 + uVar21 * 4);
      (drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->m_data[1] = fVar3;
      (drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->m_data[2] = 0.0;
      (drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->m_data[3] = 1.0;
      drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[1].m_data[0] = fVar4;
      drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[1].m_data[1] = fVar5;
      drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[1].m_data[2] = 0.0;
      drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[1].m_data[3] = 1.0;
      drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[2].m_data[0] = fVar6;
      drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[2].m_data[1] = fVar7;
      drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[2].m_data[2] = 0.0;
      drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[2].m_data[3] = 1.0;
      drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[3].m_data[0] = fVar8;
      drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[3].m_data[1] = 0.2;
      drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[3].m_data[2] = 0.0;
      drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[3].m_data[3] = 1.0;
      drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[4].m_data[0] = fVar9;
      drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[4].m_data[1] = fVar10;
      drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[4].m_data[2] = 0.0;
      drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[4].m_data[3] = 1.0;
      drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[5].m_data[0] = fVar11;
      drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[5].m_data[1] = fVar12;
      drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[5].m_data[2] = 0.0;
      drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[5].m_data[3] = 1.0;
    }
    std::vector<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>::
    resize((vector<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
            *)&local_268,
           (long)drawBuffer.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)drawBuffer.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 4);
    lVar22 = 0;
    lVar23 = 0;
    for (lVar20 = 0;
        lVar20 < (int)((long)(local_268._M_string_length - (long)local_268._M_dataplus._M_p) / 0x24)
        ; lVar20 = lVar20 + 1) {
      puVar1 = (undefined4 *)
               ((long)(drawBuffer.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar22);
      uVar14 = puVar1[1];
      uVar15 = puVar1[2];
      uVar16 = puVar1[3];
      pcVar2 = local_268._M_dataplus._M_p + lVar23;
      *(undefined4 *)pcVar2 = *puVar1;
      *(undefined4 *)(pcVar2 + 4) = uVar14;
      *(undefined4 *)(pcVar2 + 8) = uVar15;
      *(undefined4 *)(pcVar2 + 0xc) = uVar16;
      (*(this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
        [6])(this);
      *(undefined4 *)(local_268._M_dataplus._M_p + lVar23 + 0x20) = extraout_XMM0_Da_00;
      lVar23 = lVar23 + 0x24;
      lVar22 = lVar22 + 0x10;
    }
    local_1b8 = (undefined1  [8])
                ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
                m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pSStack_1b0);
    std::operator<<((ostream *)&pSStack_1b0,"Rendering ");
    std::ostream::_M_insert<unsigned_long>((ulong)&pSStack_1b0);
    std::operator<<((ostream *)&pSStack_1b0," point(s): (point size = ");
    (*(this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[6]
    )(this);
    std::ostream::operator<<((ostringstream *)&pSStack_1b0,extraout_XMM0_Da_01);
    std::operator<<((ostream *)&pSStack_1b0,")");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pSStack_1b0);
    lVar22 = 0;
    for (lVar20 = 0;
        lVar20 < (int)((long)(local_268._M_string_length - (long)local_268._M_dataplus._M_p) / 0x24)
        ; lVar20 = lVar20 + 1) {
      local_1b8 = (undefined1  [8])
                  ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
                  m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pSStack_1b0);
      std::operator<<((ostream *)&pSStack_1b0,"Point ");
      std::ostream::operator<<((ostringstream *)&pSStack_1b0,(int)lVar20 + 1);
      std::operator<<((ostream *)&pSStack_1b0,":\t");
      tcu::operator<<((ostream *)&pSStack_1b0,
                      (Vector<float,_4> *)(local_268._M_dataplus._M_p + lVar22));
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pSStack_1b0);
      lVar22 = lVar22 + 0x24;
    }
    BaseRenderingCase::drawPrimitives(&this->super_BaseRenderingCase,&resultImage,&drawBuffer,0);
    local_1d8.numSamples = (this->super_BaseRenderingCase).m_numSamples;
    local_1d8.subpixelBits = (this->super_BaseRenderingCase).m_subpixelBits;
    local_1d8.redBits = (this->super_BaseRenderingCase).m_pixelFormat.redBits;
    local_1d8.greenBits = (this->super_BaseRenderingCase).m_pixelFormat.greenBits;
    local_1d8.blueBits = (this->super_BaseRenderingCase).m_pixelFormat.blueBits;
    local_1b8 = (undefined1  [8])local_268._M_dataplus._M_p;
    pSStack_1b0 = (pointer)local_268._M_string_length;
    local_1a8[0]._M_allocated_capacity = local_268.field_2._M_allocated_capacity;
    local_268.field_2._M_allocated_capacity = 0;
    local_268._M_dataplus._M_p = (pointer)0x0;
    local_268._M_string_length = 0;
    bVar17 = tcu::verifyPointGroupRasterization
                       (&resultImage,(PointSceneSpec *)local_1b8,&local_1d8,
                        ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.
                         super_TestNode.m_testCtx)->m_log);
    if (!bVar17) {
      this->m_allIterationsPassed = false;
    }
    std::
    _Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
    ::~_Vector_base((_Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
                     *)local_1b8);
  }
  else {
    local_1b8 = (undefined1  [8])
                ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
                m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pSStack_1b0);
    std::operator<<((ostream *)&pSStack_1b0,"Point size ");
    std::ostream::operator<<((ostringstream *)&pSStack_1b0,extraout_XMM0_Da);
    std::operator<<((ostream *)&pSStack_1b0," not supported, skipping iteration.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pSStack_1b0);
  }
  iVar18 = *(int *)&(this->super_BaseRenderingCase).field_0xc4 + 1;
  *(int *)&(this->super_BaseRenderingCase).field_0xc4 = iVar18;
  if (iVar18 == this->m_iterationCount) {
    description = "Incorrect rasterization";
    if (this->m_allIterationsPassed != QP_TEST_RESULT_PASS) {
      description = "Pass";
    }
    IVar19 = STOP;
    tcu::TestContext::setTestResult
              ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,this->m_allIterationsPassed ^ QP_TEST_RESULT_FAIL,description);
  }
  else {
    IVar19 = CONTINUE;
  }
  std::
  _Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>::
  ~_Vector_base((_Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
                 *)&local_268);
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&drawBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  tcu::Surface::~Surface(&resultImage);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  std::__cxx11::string::~string((string *)&iterationDescription);
  return IVar19;
}

Assistant:

PointCase::IterateResult PointCase::iterate (void)
{
	const std::string						iterationDescription	= "Test iteration " + de::toString(m_iteration+1) + " / " + de::toString(m_iterationCount);
	const tcu::ScopedLogSection				section					(m_testCtx.getLog(), iterationDescription, iterationDescription);
	const float								pointSize				= getPointSize();
	tcu::Surface							resultImage				(m_renderSize, m_renderSize);
	std::vector<tcu::Vec4>					drawBuffer;
	std::vector<PointSceneSpec::ScenePoint>	points;

	// supported?
	if (pointSize <= m_maxPointSize)
	{
		// gen data
		generatePoints(m_iteration, drawBuffer, points);

		// draw image
		drawPrimitives(resultImage, drawBuffer, GL_POINTS);

		// compare
		{
			bool					compareOk;
			RasterizationArguments	args;
			PointSceneSpec			scene;

			args.numSamples		= m_numSamples;
			args.subpixelBits	= m_subpixelBits;
			args.redBits		= getPixelFormat().redBits;
			args.greenBits		= getPixelFormat().greenBits;
			args.blueBits		= getPixelFormat().blueBits;

			scene.points.swap(points);

			compareOk = verifyPointGroupRasterization(resultImage, scene, args, m_testCtx.getLog());

			if (!compareOk)
				m_allIterationsPassed = false;
		}
	}
	else
		m_testCtx.getLog() << tcu::TestLog::Message << "Point size " << pointSize << " not supported, skipping iteration." << tcu::TestLog::EndMessage;

	// result
	if (++m_iteration == m_iterationCount)
	{
		if (m_allIterationsPassed)
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Incorrect rasterization");

		return STOP;
	}
	else
		return CONTINUE;
}